

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathStringFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathContextPtr ctxt_00;
  xmlChar *val;
  xmlXPathObjectPtr pxVar1;
  int iStack_20;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 1) {
    if (ctxt->valueFrame < ctxt->valueNr) {
      pxVar1 = valuePop(ctxt);
      if (pxVar1 != (xmlXPathObjectPtr)0x0) {
        pxVar1 = xmlXPathCacheConvertString(ctxt->context,pxVar1);
        goto LAB_001d204c;
      }
      iStack_20 = 10;
    }
    else {
      iStack_20 = 0x17;
    }
  }
  else {
    if (nargs == 0) {
      ctxt_00 = ctxt->context;
      val = xmlXPathCastNodeToString(ctxt_00->node);
      pxVar1 = xmlXPathCacheWrapString(ctxt_00,val);
LAB_001d204c:
      valuePush(ctxt,pxVar1);
      return;
    }
    iStack_20 = 0xc;
  }
  xmlXPathErr(ctxt,iStack_20);
  return;
}

Assistant:

void
xmlXPathStringFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur;

    if (ctxt == NULL) return;
    if (nargs == 0) {
    valuePush(ctxt,
	xmlXPathCacheWrapString(ctxt->context,
	    xmlXPathCastNodeToString(ctxt->context->node)));
	return;
    }

    CHECK_ARITY(1);
    cur = valuePop(ctxt);
    if (cur == NULL) XP_ERROR(XPATH_INVALID_OPERAND);
    valuePush(ctxt, xmlXPathCacheConvertString(ctxt->context, cur));
}